

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O2

void __thiscall
kratos::Property::edge(Property *this,EventEdgeType type,shared_ptr<kratos::Var> *var)

{
  int iVar1;
  VarException *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  undefined1 local_68 [32];
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  element_type *local_30;
  allocator<char> local_22;
  allocator_type local_21;
  
  iVar1 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[7])();
  if (iVar1 == 1) {
    EventControl::EventControl
              ((EventControl *)local_68,type,
               (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    *(ulong *)((long)&(this->edge_).var + 4) = CONCAT44(local_68._16_4_,local_68._12_4_);
    (this->edge_).edge = local_68._20_4_;
    (this->edge_).delay_side = local_68._24_4_;
    (this->edge_).delay = local_68._0_8_;
    (this->edge_).var = (Var *)CONCAT44(local_68._12_4_,local_68._8_4_);
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"{0} should be width 1",&local_22);
  local_30 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_30;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_48,__l,&local_21);
  VarException::VarException(this_00,(string *)local_68,&local_48);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Property::edge(kratos::EventEdgeType type, const std::shared_ptr<Var> &var) {
    if (var->width() != 1) throw VarException("{0} should be width 1", {var.get()});
    edge_ = EventControl(type, *var);
}